

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O3

cmDefinitions *
cmDefinitions::MakeClosure
          (cmDefinitions *__return_storage_ptr__,StackConstIter *begin,StackConstIter *end)

{
  _Rb_tree_header *p_Var1;
  _List_node_base **__k;
  iterator iVar2;
  iterator iVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  __hashtable *__h;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  undefined;
  cmDefinitions *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  (__return_storage_ptr__->Map)._M_h._M_buckets =
       &(__return_storage_ptr__->Map)._M_h._M_single_bucket;
  (__return_storage_ptr__->Map)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->Map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->Map)._M_h._M_element_count = 0;
  (__return_storage_ptr__->Map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->Map)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->Map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var7 = (begin->current)._M_node;
  p_Var4 = (end->current)._M_node;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (p_Var4 != p_Var7) {
    do {
      p_Var5 = p_Var7->_M_prev;
      p_Var6 = p_Var5[2]._M_next;
      if (p_Var6 != (_List_node_base *)0x0) {
        do {
          __k = &p_Var6->_M_prev;
          iVar2 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)__return_storage_ptr__,(key_type *)__k);
          if (iVar2.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_true>
              ._M_cur == (__node_type *)0x0) {
            iVar3 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&local_60,(key_type *)__k);
            if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
              if (*(char *)&p_Var6[4]._M_prev == '\x01') {
                local_68 = __return_storage_ptr__;
                std::
                _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDefinitions::Def>,std::allocator<std::pair<std::__cxx11::string_const,cmDefinitions::Def>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::
                _M_insert<std::pair<std::__cxx11::string_const,cmDefinitions::Def>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,cmDefinitions::Def>,true>>>>
                          ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDefinitions::Def>,std::allocator<std::pair<std::__cxx11::string_const,cmDefinitions::Def>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)__return_storage_ptr__,__k,&local_68);
              }
              else {
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_60,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
                ;
              }
            }
          }
          p_Var6 = p_Var6->_M_next;
        } while (p_Var6 != (_List_node_base *)0x0);
        p_Var5 = p_Var7->_M_prev;
        p_Var4 = (end->current)._M_node;
      }
      p_Var7 = p_Var5;
    } while (p_Var5 != p_Var4);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

cmDefinitions cmDefinitions::MakeClosure(StackConstIter begin,
                                         StackConstIter end)
{
  cmDefinitions closure;
  std::set<std::string> undefined;
  for (StackConstIter it = begin; it != end; ++it)
    {
    // Consider local definitions.
    for(MapType::const_iterator mi = it->Map.begin();
        mi != it->Map.end(); ++mi)
      {
      // Use this key if it is not already set or unset.
      if(closure.Map.find(mi->first) == closure.Map.end() &&
         undefined.find(mi->first) == undefined.end())
        {
        if(mi->second.Exists)
          {
          closure.Map.insert(*mi);
          }
        else
          {
          undefined.insert(mi->first);
          }
        }
      }
    }
  return closure;
}